

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BifFileReader.cpp
# Opt level: O2

void __thiscall BifFileReader<NWN::ResRef16>::ParseBifFile(BifFileReader<NWN::ResRef16> *this)

{
  FileWrapper *this_00;
  uint uVar1;
  ULONGLONG UVar2;
  runtime_error *this_01;
  unsigned_long i;
  ulong uVar3;
  BIF_RESOURCE Key;
  BIF_HEADER Header;
  
  this_00 = &this->m_FileWrapper;
  FileWrapper::ReadFile(this_00,&Header,0x14,"Header");
  uVar1 = 0x100000;
  if (Header.VariableResourceCount < 0x100000) {
    uVar1 = Header.VariableResourceCount;
  }
  std::
  vector<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE,_std::allocator<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE>_>
  ::reserve(&this->m_ResDir,(ulong)uVar1);
  if (Header.FileType == 0x46464942) {
    if (Header.Version == 0x20203156) {
      uVar3 = (ulong)Header.VariableTableOffset;
      UVar2 = FileWrapper::GetFileSize(this_00);
      if (UVar2 != uVar3) {
        FileWrapper::SeekOffset(this_00,(ulong)Header.VariableTableOffset,"VariableTableOffset");
        for (uVar3 = 0; uVar3 < Header.VariableResourceCount; uVar3 = uVar3 + 1) {
          FileWrapper::ReadFile(this_00,&Key,0x10,"Key");
          if (uVar3 != (Key.ID & 0xfffff)) {
            this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_01,"Key.ID mismatch");
            goto LAB_00168eb0;
          }
          if (CARRY4(Key.FileSize,Key.Offset)) {
            this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_01,"Key.Offset overflow");
            goto LAB_00168eb0;
          }
          if (this->m_FileSize < (ulong)Key.FileSize + (ulong)Key.Offset) {
            this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_01,"BIF KEY entry exceeds file size");
            goto LAB_00168eb0;
          }
          std::
          vector<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE,_std::allocator<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE>_>
          ::push_back(&this->m_ResDir,&Key);
        }
      }
      return;
    }
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Header.Version is not V1 (illegal BIF file)");
  }
  else {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Header.FileType is not BIFF (illegal BIF file)");
  }
LAB_00168eb0:
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
BifFileReader< ResRefT >::ParseBifFile(
	)
/*++

Routine Description:

	This routine parses the directory structures of a BIF file and generates
	the in-memory key and resource list entry directories.

Arguments:

	None.

Return Value:

	None.  On failure, the routine raises an std::exception.

Environment:

	User mode.

--*/
{
	BIF_HEADER Header;

	m_FileWrapper.ReadFile( &Header, sizeof( Header ), "Header" );

	if (Header.VariableResourceCount < 1024 * 1024)
		m_ResDir.reserve( Header.VariableResourceCount );
	else
		m_ResDir.reserve( 1024 * 1024 );

	if (memcmp( &Header.FileType, "BIFF", 4 ))
		throw std::runtime_error( "Header.FileType is not BIFF (illegal BIF file)" );
	if (memcmp( &Header.Version, "V1  ", 4 ))
		throw std::runtime_error( "Header.Version is not V1 (illegal BIF file)" );

	if (Header.VariableTableOffset == m_FileWrapper.GetFileSize())
	{
		//Empty BIF file, skip
		return;
	}

	m_FileWrapper.SeekOffset( Header.VariableTableOffset, "VariableTableOffset" );

	for (unsigned long i = 0; i < Header.VariableResourceCount; i += 1)
	{
		BIF_RESOURCE Key;

		m_FileWrapper.ReadFile( &Key, sizeof( Key ), "Key" );

		if ((ResID) i != (ResID) (Key.ID & 0xFFFFF))
			throw std::runtime_error( "Key.ID mismatch" );

		if (Key.Offset + Key.FileSize < Key.Offset)
			throw std::runtime_error( "Key.Offset overflow" );

		if ((ULONGLONG) Key.Offset + Key.FileSize > (ULONGLONG) m_FileSize)
			throw std::runtime_error( "BIF KEY entry exceeds file size" );

		m_ResDir.push_back( Key );
	}
}